

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setCPUThreadCount
          (BeagleCPUImpl<double,_1,_0> *this,int threadCount)

{
  int iVar1;
  void *pvVar2;
  int in_ESI;
  long *in_RDI;
  int i_1;
  int sitePartition;
  int i;
  int partitionSize;
  int *patternPartitions;
  int partitionCount;
  int hardwareThreads;
  int local_38;
  int local_34;
  int local_30;
  int local_1c;
  int local_4;
  
  if (in_ESI < 1) {
    local_4 = -5;
  }
  else {
    *(undefined1 *)((long)in_RDI + 0x13c) = 0;
    *(undefined1 *)((long)in_RDI + 0x13d) = 0;
    if ((in_RDI[0xb] & 0x40000000U) != 0) {
      iVar1 = std::thread::hardware_concurrency();
      if (*(int *)((long)in_RDI + 0x24) < 5) {
        *(undefined4 *)((long)in_RDI + 0x54) = 0x100;
        if (iVar1 < 0x10) {
          *(undefined4 *)((long)in_RDI + 0x54) = 0x300;
        }
      }
      else {
        *(undefined4 *)((long)in_RDI + 0x54) = 2;
      }
      if ((*(int *)((long)in_RDI + 0x54) <= *(int *)((long)in_RDI + 0x14)) && (2 < iVar1)) {
        local_1c = *(int *)((long)in_RDI + 0x14) / (*(int *)((long)in_RDI + 0x54) / 2);
        if (in_ESI < local_1c) {
          local_1c = in_ESI;
        }
        pvVar2 = malloc((long)*(int *)((long)in_RDI + 0x14) << 2);
        iVar1 = *(int *)((long)in_RDI + 0x14);
        for (local_30 = 0; local_30 < *(int *)((long)in_RDI + 0x14); local_30 = local_30 + 1) {
          local_34 = local_30 / (iVar1 / local_1c);
          if (local_1c + -1 < local_34) {
            local_34 = local_1c + -1;
          }
          *(int *)((long)pvVar2 + (long)local_30 * 4) = local_34;
        }
        (**(code **)(*in_RDI + 0x70))(in_RDI,local_1c,pvVar2);
        pvVar2 = malloc((long)*(int *)((long)in_RDI + 0xc) * 4 * (long)(int)in_RDI[9] * 9);
        in_RDI[0x2b] = (long)pvVar2;
        if (*(int *)((long)in_RDI + 0x54) * 4 <= *(int *)((long)in_RDI + 0x14)) {
          pvVar2 = malloc((long)local_1c << 2);
          in_RDI[0x2c] = (long)pvVar2;
          for (local_38 = 0; local_38 < local_1c; local_38 = local_38 + 1) {
            *(int *)(in_RDI[0x2c] + (long)local_38 * 4) = local_38;
          }
          pvVar2 = malloc((long)local_1c << 3);
          in_RDI[0x2d] = (long)pvVar2;
          *(undefined1 *)((long)in_RDI + 0x13e) = 1;
        }
        *(undefined1 *)((long)in_RDI + 0x13d) = 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCPUThreadCount(int threadCount) {

    if (threadCount < 1)
        return BEAGLE_ERROR_OUT_OF_RANGE;

    kThreadingEnabled = false;
    kAutoPartitioningEnabled = false;
    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        int hardwareThreads = std::thread::hardware_concurrency();
        if (kStateCount <= 4) {
            kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_LOW;
            if (hardwareThreads < BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD) {
                kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_HIGH;
            }
        } else {
            // todo: assess minimum pattern count for efficient auto-threading
            //       for higher state-count values
            kMinPatternCount = 2;
        }
        if (kPatternCount >= kMinPatternCount && hardwareThreads > 2) {
            int partitionCount = kPatternCount/(kMinPatternCount/2);
            if (partitionCount > threadCount) {
                partitionCount = threadCount;
            }

            int* patternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
            int partitionSize = kPatternCount/partitionCount;
            for (int i=0; i<kPatternCount; i++) {
                int sitePartition = i/partitionSize;
                if (sitePartition > partitionCount - 1)
                    sitePartition = partitionCount - 1;
                patternPartitions[i] = sitePartition;
            }
            setPatternPartitions(partitionCount, patternPartitions);

            gAutoPartitionOperations = (int*) malloc(sizeof(int) * kBufferCount * kPartitionCount * BEAGLE_PARTITION_OP_COUNT);

            if (kPatternCount >= kMinPatternCount*4) {
                gAutoPartitionIndices = (int*) malloc(sizeof(int) * partitionCount);
                for (int i=0; i<partitionCount; i++) {
                    gAutoPartitionIndices[i] = i;
                }
                gAutoPartitionOutSumLogLikelihoods = (double*) malloc(sizeof(double) * partitionCount);
                kAutoRootPartitioningEnabled = true;
            }

            kAutoPartitioningEnabled = true;
        }
    }

    return BEAGLE_SUCCESS;
}